

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *URL_00;
  int result;
  char *URL;
  char **argv_local;
  int argc_local;
  
  setlocale(6,"");
  if (argc < 2) {
    curl_mfprintf(_stderr,"Pass URL as argument please\n");
    argv_local._4_4_ = 1;
  }
  else {
    if (2 < argc) {
      libtest_arg2 = argv[2];
    }
    if (3 < argc) {
      libtest_arg3 = argv[3];
    }
    URL_00 = argv[1];
    test_argc = argc;
    test_argv = argv;
    curl_mfprintf(_stderr,"URL: %s\n",URL_00);
    argv_local._4_4_ = test(URL_00);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
  char *URL;
  int result;

#ifdef O_BINARY
#  ifdef __HIGHC__
  _setmode(stdout, O_BINARY);
#  else
  setmode(fileno(stdout), O_BINARY);
#  endif
#endif

  memory_tracking_init();

  /*
   * Setup proper locale from environment. This is needed to enable locale-
   * specific behaviour by the C library in order to test for undesired side
   * effects that could cause in libcurl.
   */
#ifdef HAVE_SETLOCALE
  setlocale(LC_ALL, "");
#endif

  if(argc< 2) {
    fprintf(stderr, "Pass URL as argument please\n");
    return 1;
  }

  test_argc = argc;
  test_argv = argv;

  if(argc>2)
    libtest_arg2=argv[2];

  if(argc>3)
    libtest_arg3=argv[3];

  URL = argv[1]; /* provide this to the rest */

  fprintf(stderr, "URL: %s\n", URL);

  result = test(URL);

#ifdef USE_NSS
  if(PR_Initialized())
    /* prevent valgrind from reporting possibly lost memory (fd cache, ...) */
    PR_Cleanup();
#endif

  return result;
}